

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O3

deBool deSocket_listen(deSocket *sock,deSocketAddress *address)

{
  deBool dVar1;
  int iVar2;
  int iVar3;
  NativeSocklen *in_RCX;
  int __protocol;
  NativeSocklen bsdAddrLen;
  int reuseVal;
  deUint8 bsdAddrBuf [28];
  undefined1 local_40 [40];
  
  if ((sock->state == DE_SOCKETSTATE_CLOSED) &&
     (dVar1 = deSocketAddressToBsdAddress
                        (address,(size_t)(local_40 + 8),(sockaddr *)local_40,in_RCX), dVar1 != 0)) {
    iVar3 = 1;
    if (address->type != DE_SOCKETTYPE_STREAM) {
      iVar3 = (uint)(address->type == DE_SOCKETTYPE_DATAGRAM) * 2;
    }
    iVar2 = 0x11;
    if (address->protocol != DE_SOCKETPROTOCOL_UDP) {
      iVar2 = 0;
    }
    __protocol = 6;
    if (address->protocol != DE_SOCKETPROTOCOL_TCP) {
      __protocol = iVar2;
    }
    iVar3 = socket((uint)(ushort)local_40._8_2_,iVar3,__protocol);
    sock->handle = iVar3;
    if (iVar3 != -1) {
      sock->state = DE_SOCKETSTATE_DISCONNECTED;
      local_40[4] = '\x01';
      local_40[5] = '\0';
      local_40[6] = '\0';
      local_40[7] = '\0';
      setsockopt(iVar3,1,2,local_40 + 4,4);
      iVar3 = bind(sock->handle,(sockaddr *)(local_40 + 8),local_40._0_4_);
      if ((iVar3 == 0) && (iVar3 = listen(sock->handle,4), iVar3 == 0)) {
        sock->state = DE_SOCKETSTATE_LISTENING;
        return 1;
      }
      deSocket_close(sock);
    }
  }
  return 0;
}

Assistant:

deBool deSocket_listen (deSocket* sock, const deSocketAddress* address)
{
	const int			backlogSize	= 4;
	deUint8				bsdAddrBuf[sizeof(struct sockaddr_in6)];
	struct sockaddr*	bsdAddr		= (struct sockaddr*)&bsdAddrBuf[0];
	NativeSocklen		bsdAddrLen;

	if (sock->state != DE_SOCKETSTATE_CLOSED)
		return DE_FALSE;

	/* Resolve address. */
	if (!deSocketAddressToBsdAddress(address, sizeof(bsdAddrBuf), bsdAddr, &bsdAddrLen))
		return DE_FALSE;

	/* Create socket. */
	sock->handle = socket(bsdAddr->sa_family, deSocketTypeToBsdType(address->type), deSocketProtocolToBsdProtocol(address->protocol));
	if (!deSocketHandleIsValid(sock->handle))
		return DE_FALSE;

	sock->state = DE_SOCKETSTATE_DISCONNECTED;

	/* Allow re-using address. */
	{
		int reuseVal = 1;
		setsockopt(sock->handle, SOL_SOCKET, SO_REUSEADDR, (const char*)&reuseVal, (int)sizeof(reuseVal));
	}

	/* Bind to address. */
	if (bind(sock->handle, bsdAddr, (NativeSocklen)bsdAddrLen) != 0)
	{
		deSocket_close(sock);
		return DE_FALSE;
	}

	/* Start listening. */
	if (listen(sock->handle, backlogSize) != 0)
	{
		deSocket_close(sock);
		return DE_FALSE;
	}

	sock->state = DE_SOCKETSTATE_LISTENING;

	return DE_TRUE;
}